

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

FButtonStatus * FindButton(uint key)

{
  int min;
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0x1f;
  iVar3 = 0;
  do {
    uVar1 = (uint)(iVar3 + iVar2) >> 1;
    if (ActionMaps[uVar1].Key == key) {
      return ActionMaps[uVar1].Button;
    }
    if (ActionMaps[uVar1].Key < key) {
      iVar3 = uVar1 + 1;
    }
    else {
      iVar2 = uVar1 - 1;
    }
  } while (iVar3 <= iVar2);
  return (FButtonStatus *)0x0;
}

Assistant:

FButtonStatus *FindButton (unsigned int key)
{
	const FActionMap *bit;

	bit = BinarySearch<FActionMap, unsigned int>
			(ActionMaps, NUM_ACTIONS, &FActionMap::Key, key);
	return bit ? bit->Button : NULL;
}